

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_base.h
# Opt level: O2

void __thiscall
draco::EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::SetEncodingMethod
          (EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_> *this,
          int encoding_method)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"encoding_method",&local_39);
  Options::SetInt((Options *)&this->options_,&local_38,encoding_method);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void SetEncodingMethod(int encoding_method) {
    options_.SetGlobalInt("encoding_method", encoding_method);
  }